

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_ee4d9::CommandLineParser::registerSubCommand
          (CommandLineParser *this,SubCommand *sub)

{
  SmallPtrSet<llvm::cl::SubCommand_*,_4U> *this_00;
  ushort uVar1;
  uint uVar2;
  size_t __n_00;
  StringMapEntryBase **ppSVar3;
  StringMapEntryBase *pSVar4;
  Option *Opt;
  int iVar5;
  SubCommand *pSVar6;
  difference_type __n;
  long lVar7;
  bool bVar8;
  SmallPtrSetIteratorImpl SVar9;
  iterator iVar10;
  StringRef Name;
  iterator __begin3;
  pair<llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>,_bool> local_58;
  SmallPtrSetIteratorImpl local_40;
  
  this_00 = &this->RegisteredSubCommands;
  SVar9 = (SmallPtrSetIteratorImpl)
          llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                    (&this_00->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
  iVar10 = llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                     (&this_00->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
  lVar7 = 0;
  local_40.Bucket = SVar9.Bucket;
  while (local_40 = SVar9, bVar8 = local_40.Bucket != iVar10.super_SmallPtrSetIteratorImpl.Bucket,
        bVar8) {
    local_58.first.super_SmallPtrSetIteratorImpl.End = local_40.End;
    local_58.first.super_SmallPtrSetIteratorImpl.Bucket = local_40.Bucket;
    pSVar6 = llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*(&local_58.first);
    __n_00 = (sub->Name).Length;
    if ((__n_00 != 0) && ((pSVar6->Name).Length == __n_00)) {
      iVar5 = bcmp((pSVar6->Name).Data,(sub->Name).Data,__n_00);
      lVar7 = lVar7 + (ulong)(iVar5 == 0);
    }
    llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++
              ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)&local_40);
    SVar9 = local_40;
  }
  if (lVar7 == 0) {
    llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::insert
              (&local_58,&this_00->super_SmallPtrSetImpl<llvm::cl::SubCommand_*>,sub);
    pSVar6 = llvm::
             ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
             ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                          *)llvm::cl::AllSubCommands);
    if (pSVar6 != sub) {
      pSVar6 = llvm::
               ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
               ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                            *)llvm::cl::AllSubCommands);
      local_58.first.super_SmallPtrSetIteratorImpl.Bucket =
           (void **)llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::begin
                              (&pSVar6->OptionsMap);
      uVar2 = (pSVar6->OptionsMap).super_StringMapImpl.NumBuckets;
      ppSVar3 = (pSVar6->OptionsMap).super_StringMapImpl.TheTable;
      while ((StringMapEntryBase **)local_58.first.super_SmallPtrSetIteratorImpl.Bucket !=
             ppSVar3 + uVar2) {
        pSVar4 = (StringMapEntryBase *)*local_58.first.super_SmallPtrSetIteratorImpl.Bucket;
        Opt = (Option *)pSVar4[1].StrLen;
        uVar1 = *(ushort *)&Opt->field_0xc;
        if (((((uVar1 & 7) == 4) || ((uVar1 & 0x180) == 0x80)) || ((uVar1 & 0x800) != 0)) ||
           ((Opt->ArgStr).Length != 0)) {
          addOption(this,Opt,sub);
        }
        else {
          Name.Data = pSVar4 + 2;
          Name.Length = pSVar4->StrLen;
          addLiteralOption(this,Opt,sub,Name);
        }
        llvm::
        StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
        ::operator++((StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
                      *)&local_58);
      }
    }
    return;
  }
  __assert_fail("count_if(RegisteredSubCommands, [sub](const SubCommand *Sub) { return (!sub->getName().empty()) && (Sub->getName() == sub->getName()); }) == 0 && \"Duplicate subcommands\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                ,0x125,
                "void (anonymous namespace)::CommandLineParser::registerSubCommand(SubCommand *)");
}

Assistant:

void registerSubCommand(SubCommand *sub) {
    assert(count_if(RegisteredSubCommands,
                    [sub](const SubCommand *Sub) {
                      return (!sub->getName().empty()) &&
                             (Sub->getName() == sub->getName());
                    }) == 0 &&
           "Duplicate subcommands");
    RegisteredSubCommands.insert(sub);

    // For all options that have been registered for all subcommands, add the
    // option to this subcommand now.
    if (sub != &*AllSubCommands) {
      for (auto &E : AllSubCommands->OptionsMap) {
        Option *O = E.second;
        if ((O->isPositional() || O->isSink() || O->isConsumeAfter()) ||
            O->hasArgStr())
          addOption(O, sub);
        else
          addLiteralOption(*O, sub, E.first());
      }
    }
  }